

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O1

xmlNodePtr xmlSAX2TextNode(xmlParserCtxtPtr ctxt,xmlChar *str,int len)

{
  xmlChar xVar1;
  byte bVar2;
  xmlNodePtr pxVar3;
  xmlChar *pxVar4;
  xmlRegisterNodeFunc *pp_Var5;
  _xmlAttr **__dest;
  ulong uVar6;
  int iVar7;
  size_t __n;
  
  pxVar3 = ctxt->freeElems;
  if (pxVar3 == (xmlNodePtr)0x0) {
    pxVar3 = (xmlNodePtr)(*xmlMalloc)(0x78);
  }
  else {
    ctxt->freeElems = pxVar3->next;
    ctxt->freeElemsNr = ctxt->freeElemsNr + -1;
  }
  if (pxVar3 == (xmlNodePtr)0x0) {
    xmlErrMemory(ctxt,"xmlSAX2Characters");
LAB_001831fb:
    pxVar3 = (xmlNodePtr)0x0;
  }
  else {
    pxVar3->nsDef = (xmlNs *)0x0;
    pxVar3->psvi = (void *)0x0;
    pxVar3->content = (xmlChar *)0x0;
    pxVar3->properties = (_xmlAttr *)0x0;
    pxVar3->doc = (_xmlDoc *)0x0;
    pxVar3->ns = (xmlNs *)0x0;
    pxVar3->next = (_xmlNode *)0x0;
    pxVar3->prev = (_xmlNode *)0x0;
    pxVar3->last = (_xmlNode *)0x0;
    pxVar3->parent = (_xmlNode *)0x0;
    pxVar3->name = (xmlChar *)0x0;
    pxVar3->children = (_xmlNode *)0x0;
    pxVar3->_private = (void *)0x0;
    *(undefined8 *)&pxVar3->type = 0;
    pxVar3->line = 0;
    pxVar3->extra = 0;
    *(undefined4 *)&pxVar3->field_0x74 = 0;
    if (ctxt->dictNames == 0) {
      __dest = (_xmlAttr **)0x0;
    }
    else {
      __n = (size_t)len;
      xVar1 = str[__n];
      if ((len < 0x10) && ((ctxt->options & 0x10000) != 0)) {
        __dest = &pxVar3->properties;
        memcpy(__dest,str,__n);
        *(undefined1 *)((long)&pxVar3->properties + __n) = 0;
LAB_00183235:
        iVar7 = 0;
      }
      else {
        if ((len < 4) &&
           (((xVar1 == '\"' || (xVar1 == '\'')) || ((xVar1 == '<' && (str[__n + 1] != '!')))))) {
          __dest = (_xmlAttr **)xmlDictLookup(ctxt->dict,str,len);
          goto LAB_00183235;
        }
        bVar2 = *str;
        if ((0x20 < (ulong)bVar2) || ((0x100000600U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) {
          __dest = (_xmlAttr **)0x0;
          if ((len < 0x3c) && (bVar2 == 0xd)) goto LAB_0018331e;
          goto LAB_00183235;
        }
        __dest = (_xmlAttr **)0x0;
        if (0x3b < len) goto LAB_00183235;
LAB_0018331e:
        __dest = (_xmlAttr **)0x0;
        iVar7 = 0;
        if (xVar1 == '<') {
          if (str[__n + 1] == '!') {
LAB_00183335:
            __dest = (_xmlAttr **)0x0;
          }
          else {
            if (1 < len) {
              uVar6 = 1;
              do {
                if ((0x20 < (ulong)str[uVar6]) ||
                   ((0x100002600U >> ((ulong)str[uVar6] & 0x3f) & 1) == 0)) {
                  iVar7 = 5;
                  goto LAB_00183335;
                }
                uVar6 = uVar6 + 1;
              } while ((uint)len != uVar6);
            }
            __dest = (_xmlAttr **)xmlDictLookup(ctxt->dict,str,len);
          }
        }
      }
      if ((iVar7 != 5) && (iVar7 != 0)) {
        return pxVar3;
      }
    }
    pxVar3->type = XML_TEXT_NODE;
    pxVar3->name = "text";
    if (__dest == (_xmlAttr **)0x0) {
      pxVar4 = xmlStrndup(str,len);
      pxVar3->content = pxVar4;
      if (pxVar4 == (xmlChar *)0x0) {
        xmlSAX2ErrMemory(ctxt,"xmlSAX2TextNode");
        (*xmlFree)(pxVar3);
        goto LAB_001831fb;
      }
    }
    else {
      pxVar3->content = (xmlChar *)__dest;
    }
    if ((ctxt->linenumbers != 0) && (ctxt->input != (xmlParserInputPtr)0x0)) {
      iVar7 = ctxt->input->line;
      if ((long)iVar7 < 0xffff) {
        pxVar3->line = (unsigned_short)iVar7;
      }
      else {
        pxVar3->line = 0xffff;
        if ((ctxt->options & 0x400000) != 0) {
          pxVar3->psvi = (void *)(long)iVar7;
        }
      }
    }
    if ((__xmlRegisterCallbacks != 0) &&
       (pp_Var5 = __xmlRegisterNodeDefaultValue(), *pp_Var5 != (xmlRegisterNodeFunc)0x0)) {
      pp_Var5 = __xmlRegisterNodeDefaultValue();
      (**pp_Var5)(pxVar3);
    }
  }
  return pxVar3;
}

Assistant:

static xmlNodePtr
xmlSAX2TextNode(xmlParserCtxtPtr ctxt, const xmlChar *str, int len) {
    xmlNodePtr ret;
    const xmlChar *intern = NULL;

    /*
     * Allocate
     */
    if (ctxt->freeElems != NULL) {
	ret = ctxt->freeElems;
	ctxt->freeElems = ret->next;
	ctxt->freeElemsNr--;
    } else {
	ret = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
    }
    if (ret == NULL) {
        xmlErrMemory(ctxt, "xmlSAX2Characters");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlNode));
    /*
     * intern the formatting blanks found between tags, or the
     * very short strings
     */
    if (ctxt->dictNames) {
        xmlChar cur = str[len];

	if ((len < (int) (2 * sizeof(void *))) &&
	    (ctxt->options & XML_PARSE_COMPACT)) {
	    /* store the string in the node overriding properties and nsDef */
	    xmlChar *tmp = (xmlChar *) &(ret->properties);
	    memcpy(tmp, str, len);
	    tmp[len] = 0;
	    intern = tmp;
	} else if ((len <= 3) && ((cur == '"') || (cur == '\'') ||
	    ((cur == '<') && (str[len + 1] != '!')))) {
	    intern = xmlDictLookup(ctxt->dict, str, len);
	} else if (IS_BLANK_CH(*str) && (len < 60) && (cur == '<') &&
	           (str[len + 1] != '!')) {
	    int i;

	    for (i = 1;i < len;i++) {
		if (!IS_BLANK_CH(str[i])) goto skip;
	    }
	    intern = xmlDictLookup(ctxt->dict, str, len);
	}
    }
skip:
    ret->type = XML_TEXT_NODE;

    ret->name = xmlStringText;
    if (intern == NULL) {
	ret->content = xmlStrndup(str, len);
	if (ret->content == NULL) {
	    xmlSAX2ErrMemory(ctxt, "xmlSAX2TextNode");
	    xmlFree(ret);
	    return(NULL);
	}
    } else
	ret->content = (xmlChar *) intern;

    if (ctxt->linenumbers) {
	if (ctxt->input != NULL) {
	    if (ctxt->input->line < 65535)
		ret->line = (short) ctxt->input->line;
	    else {
	        ret->line = 65535;
		if (ctxt->options & XML_PARSE_BIG_LINES)
		    ret->psvi = (void *) (ptrdiff_t) ctxt->input->line;
	    }
	}
    }

    if ((__xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue(ret);
    return(ret);
}